

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(Curl_easy *data)

{
  curl_off_t size;
  FILE *whereto;
  undefined1 auVar1 [12];
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  timediff_t tVar5;
  curl_off_t cVar6;
  curl_off_t cVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  curl_off_t cVar15;
  uint uVar16;
  curltime newer;
  curltime older;
  curltime older_00;
  curltime cVar17;
  long local_a8;
  long local_a0;
  char local_96 [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  cVar17 = Curl_now();
  lVar11 = cVar17.tv_sec;
  uVar2 = (data->progress).start.tv_sec;
  uVar3 = (data->progress).start.tv_usec;
  older.tv_usec = uVar3;
  older.tv_sec = uVar2;
  auVar1 = cVar17._0_12_;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  older._12_4_ = 0;
  tVar5 = Curl_timediff_us(newer,older);
  (data->progress).timespent = tVar5;
  cVar15 = (data->progress).downloaded;
  cVar6 = trspeed(cVar15,tVar5);
  (data->progress).dlspeed = cVar6;
  size = (data->progress).uploaded;
  cVar7 = trspeed(size,tVar5);
  (data->progress).ulspeed = cVar7;
  lVar10 = (data->progress).lastshow;
  if (lVar10 != lVar11) {
    iVar4 = (data->progress).speeder_c;
    iVar14 = iVar4 % 6;
    (data->progress).lastshow = lVar11;
    (data->progress).speeder[iVar14] = size + cVar15;
    (data->progress).speeder_time[iVar14].tv_sec = lVar11;
    (data->progress).speeder_time[iVar14].tv_usec = cVar17.tv_usec;
    (data->progress).speeder_c = iVar4 + 1U;
    if (iVar4 == 0) {
      lVar13 = cVar7 + cVar6;
    }
    else {
      uVar12 = (ulong)(iVar4 + 1U) % 6;
      if (iVar4 < 5) {
        uVar12 = 0;
      }
      uVar8 = (ulong)(uint)((int)uVar12 << 4);
      cVar17._12_4_ = 0;
      cVar17.tv_sec = auVar1._0_8_;
      cVar17.tv_usec = auVar1._8_4_;
      older_00.tv_usec = *(undefined4 *)((long)&(data->progress).speeder_time[0].tv_usec + uVar8);
      older_00.tv_sec = *(undefined8 *)((long)&(data->progress).speeder_time[0].tv_sec + uVar8);
      older_00._12_4_ = 0;
      tVar5 = Curl_timediff(cVar17,older_00);
      lVar13 = tVar5 + (ulong)(tVar5 == 0);
      lVar9 = (data->progress).speeder[iVar14] - (data->progress).speeder[uVar12];
      if (lVar9 < 0x418938) {
        lVar13 = (lVar9 * 1000) / lVar13;
      }
      else {
        lVar13 = (long)((double)lVar9 / ((double)lVar13 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar13;
  }
  if (((data->progress).flags & 0x10) != 0) {
    return 0;
  }
  if ((data->set).fxferinfo == (curl_xferinfo_callback)0x0) {
    if ((data->set).fprogress != (curl_progress_callback)0x0) {
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fprogress)
                        ((data->set).progress_client,(double)(data->progress).size_dl,
                         (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                         (double)(data->progress).uploaded);
      goto LAB_004c966e;
    }
  }
  else {
    Curl_set_in_callback(data,true);
    iVar4 = (*(data->set).fxferinfo)
                      ((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_004c966e:
    Curl_set_in_callback(data,false);
    if (iVar4 == 0) {
      return 0;
    }
    if (iVar4 != 0x10000001) {
      Curl_failf(data,"Callback aborted");
      return iVar4;
    }
  }
  if (lVar10 == lVar11) {
    return 0;
  }
  lVar10 = (data->progress).timespent / 1000000;
  uVar16 = (data->progress).flags;
  if (-1 < (char)uVar16) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %ld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar16 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar16;
  }
  if (((uVar16 & 0x20) == 0) || (lVar11 = (data->progress).ulspeed, lVar11 < 1)) {
    lVar11 = 0;
LAB_004c9764:
    local_a8 = 0;
  }
  else {
    uVar12 = (data->progress).size_ul;
    lVar11 = (long)uVar12 / lVar11;
    if ((long)uVar12 < 0x2711) {
      if ((long)uVar12 < 1) goto LAB_004c9764;
      local_a8 = (data->progress).uploaded * 100;
    }
    else {
      local_a8 = (data->progress).uploaded;
      uVar12 = uVar12 / 100;
    }
    local_a8 = local_a8 / (long)uVar12;
  }
  if (((uVar16 & 0x40) == 0) || (lVar13 = (data->progress).dlspeed, lVar13 < 1)) {
    lVar13 = 0;
LAB_004c97cb:
    local_a0 = 0;
  }
  else {
    uVar12 = (data->progress).size_dl;
    lVar13 = (long)uVar12 / lVar13;
    if ((long)uVar12 < 0x2711) {
      if ((long)uVar12 < 1) goto LAB_004c97cb;
      local_a0 = (data->progress).downloaded * 100;
    }
    else {
      local_a0 = (data->progress).downloaded;
      uVar12 = uVar12 / 100;
    }
    local_a0 = local_a0 / (long)uVar12;
  }
  if (lVar13 < lVar11) {
    lVar13 = lVar11;
  }
  cVar15 = 0;
  if (0 < lVar13) {
    cVar15 = lVar13 - lVar10;
  }
  time2str(time_left,cVar15);
  time2str(time_total,lVar13);
  time2str(local_96,lVar10);
  uVar16 = (data->progress).flags;
  uVar12 = (&(data->progress).size_dl)[(ulong)((uVar16 & 0x40) == 0) * 2] +
           (&(data->progress).size_ul)[(ulong)((uVar16 & 0x20) == 0) * 2];
  lVar10 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar12 < 0x2711) {
    if ((long)uVar12 < 1) {
      lVar10 = 0;
    }
    else {
      lVar10 = (lVar10 * 100) / (long)uVar12;
    }
  }
  else {
    lVar10 = lVar10 / (long)(uVar12 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar12,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3ld %s  %3ld %s  %3ld %s  %s  %s %s %s %s %s",lVar10,max5 + 2,local_a0,
                max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,local_96,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct Curl_easy *data)
{
  struct curltime now = Curl_now(); /* what time is it */
  bool showprogress = progress_calc(data, now);
  if(!(data->progress.flags & PGRS_HIDE)) {
    if(data->set.fxferinfo) {
      int result;
      /* There's a callback set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fxferinfo(data->set.progress_client,
                                   data->progress.size_dl,
                                   data->progress.downloaded,
                                   data->progress.size_ul,
                                   data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }
    else if(data->set.fprogress) {
      int result;
      /* The older deprecated callback is set, call that */
      Curl_set_in_callback(data, true);
      result = data->set.fprogress(data->set.progress_client,
                                   (double)data->progress.size_dl,
                                   (double)data->progress.downloaded,
                                   (double)data->progress.size_ul,
                                   (double)data->progress.uploaded);
      Curl_set_in_callback(data, false);
      if(result != CURL_PROGRESSFUNC_CONTINUE) {
        if(result)
          failf(data, "Callback aborted");
        return result;
      }
    }

    if(showprogress)
      progress_meter(data);
  }

  return 0;
}